

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpsc_mbox.hpp
# Opt level: O1

void __thiscall
so_5::impl::limitless_mpsc_mbox_template<so_5::impl::msg_tracing_helpers::tracing_disabled_base>::
unsubscribe_event_handlers
          (limitless_mpsc_mbox_template<so_5::impl::msg_tracing_helpers::tracing_disabled_base>
           *this,type_index *param_1,agent_t *subscriber)

{
  bool bVar1;
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  LOCK();
  bVar1 = (this->m_lock).m_counters.super___atomic_base<unsigned_long>._M_i == 0;
  if (bVar1) {
    (this->m_lock).m_counters.super___atomic_base<unsigned_long>._M_i = 1;
  }
  UNLOCK();
  if (!bVar1) {
    do {
      if ((this->m_lock).m_counters.super___atomic_base<unsigned_long>._M_i == 0) {
        LOCK();
        bVar1 = (this->m_lock).m_counters.super___atomic_base<unsigned_long>._M_i == 0;
        if (bVar1) {
          (this->m_lock).m_counters.super___atomic_base<unsigned_long>._M_i = 1;
        }
        UNLOCK();
        if (bVar1) break;
      }
      sched_yield();
    } while( true );
  }
  if (this->m_single_consumer != subscriber) {
    local_38[0] = local_28;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_38,"the only one consumer can remove subscription to mpsc_mbox","");
    exception_t::raise(0x24ce10);
    if (local_38[0] != local_28) {
      operator_delete(local_38[0]);
    }
  }
  if (this->m_subscriptions_count != 0) {
    this->m_subscriptions_count = this->m_subscriptions_count - 1;
  }
  LOCK();
  (this->m_lock).m_counters.super___atomic_base<unsigned_long>._M_i =
       (this->m_lock).m_counters.super___atomic_base<unsigned_long>._M_i - 1;
  UNLOCK();
  return;
}

Assistant:

virtual void
		unsubscribe_event_handlers(
			const std::type_index & /*msg_type*/,
			agent_t * subscriber ) override
			{
				std::lock_guard< default_rw_spinlock_t > lock{ m_lock };

				if( subscriber != m_single_consumer )
					SO_5_THROW_EXCEPTION(
							rc_illegal_subscriber_for_mpsc_mbox,
							"the only one consumer can remove subscription to mpsc_mbox" );
				if( m_subscriptions_count )
					--m_subscriptions_count;
			}